

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O2

void __thiscall
TPZCheckMesh::BuildDependList(TPZCheckMesh *this,int connect,TPZStack<int,_10> *dependlist)

{
  uint uVar1;
  TPZConnect *pTVar2;
  TPZDepend *pTVar3;
  ulong nelem;
  ulong uVar4;
  
  uVar1 = (uint)(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  nelem = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = nelem;
  }
  for (; uVar4 != nelem; nelem = nelem + 1) {
    pTVar2 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
    if ((pTVar2->fDependList != (TPZDepend *)0x0) &&
       (pTVar3 = TPZConnect::TPZDepend::HasDepend(pTVar2->fDependList,(long)connect),
       pTVar3 != (TPZDepend *)0x0)) {
      TPZStack<int,_10>::Push(dependlist,(int)nelem);
    }
  }
  return;
}

Assistant:

void TPZCheckMesh::BuildDependList(int connect, TPZStack<int> &dependlist) {
	int nconnects = fMesh->ConnectVec().NElements();
	int ic;
	for(ic=0; ic<nconnects; ic++) {
		TPZConnect::TPZDepend *dep = fMesh->ConnectVec()[ic].FirstDepend();
		if(dep && dep->HasDepend(connect)) {
			dependlist.Push(ic);
			continue;
		}
	}
}